

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.h
# Opt level: O0

void http_s_new(http_s *h,http_fio_protocol_s *owner,http_vtable_s *vtbl)

{
  http_vtable_s *local_a0;
  http_fio_protocol_s *local_98;
  FIOBJ local_90;
  timespec local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  FIOBJ local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  http_vtable_s *local_20;
  http_vtable_s *vtbl_local;
  http_fio_protocol_s *owner_local;
  http_s *h_local;
  
  local_a0 = vtbl;
  local_98 = owner;
  local_20 = vtbl;
  vtbl_local = (http_vtable_s *)owner;
  owner_local = (http_fio_protocol_s *)h;
  local_90 = fiobj_hash_new();
  local_88 = fio_last_tick();
  local_78 = 0;
  local_70 = 0;
  local_68 = 0;
  local_60 = 200;
  local_58 = 0;
  local_50 = 0;
  local_48 = fiobj_hash_new();
  local_40 = 0;
  local_38 = 0;
  local_30 = 0;
  local_28 = 0;
  memcpy(h,&local_a0,0x80);
  return;
}

Assistant:

static inline void http_s_new(http_s *h, http_fio_protocol_s *owner,
                              http_vtable_s *vtbl) {
  *h = (http_s){
      .private_data =
          {
              .vtbl = vtbl,
              .flag = (uintptr_t)owner,
              .out_headers = fiobj_hash_new(),
          },
      .headers = fiobj_hash_new(),
      .received_at = fio_last_tick(),
      .status = 200,
  };
}